

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reading.c
# Opt level: O3

int read_all_shapes(FILE *fp,shape_t **records)

{
  shape_t **ppsVar1;
  int iVar2;
  uint fields_number;
  int iVar3;
  shape_t *psVar4;
  int i_2;
  char **ppcVar5;
  size_t i_3;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  char **field_names;
  char **record_values;
  char **local_58;
  shape_t **local_50;
  char **local_48;
  ulong local_40;
  FILE *local_38;
  
  local_48 = (char **)0x0;
  local_50 = records;
  iVar2 = count_lines(fp);
  local_58 = (char **)0x0;
  local_38 = fp;
  fields_number = read_header(fp,&local_58);
  ppcVar5 = local_58;
  if ((int)fields_number < 0) {
    iVar2 = -1;
    if (local_58 == (char **)0x0) {
      return -1;
    }
  }
  else {
    if (iVar2 < 2) {
      if (local_58 != (char **)0x0) {
        if (fields_number != 0) {
          uVar7 = 0;
          do {
            free(ppcVar5[uVar7]);
            uVar7 = uVar7 + 1;
          } while (fields_number != uVar7);
        }
        free(ppcVar5);
      }
      return -(uint)(iVar2 != 1);
    }
    local_40 = (ulong)(iVar2 - 1);
    psVar4 = (shape_t *)malloc(local_40 * 0x70);
    ppcVar5 = local_58;
    *local_50 = psVar4;
    if (psVar4 == (shape_t *)0x0) {
      if (local_58 == (char **)0x0) {
        return -1;
      }
      if (fields_number != 0) {
        uVar7 = 0;
        do {
          free(ppcVar5[uVar7]);
          uVar7 = uVar7 + 1;
        } while (fields_number != uVar7);
      }
      free(ppcVar5);
      return -1;
    }
    uVar7 = 0;
    iVar2 = 0;
    do {
      iVar3 = read_record(local_38,fields_number,&local_48);
      if (0 < iVar3) {
        read_shape(*local_50 + uVar7,fields_number,local_58,local_48);
        iVar2 = iVar2 + 1;
      }
      ppcVar5 = local_48;
      if (local_48 != (char **)0x0) {
        if (fields_number != 0) {
          uVar6 = 0;
          do {
            free(ppcVar5[uVar6]);
            uVar6 = uVar6 + 1;
          } while (fields_number != uVar6);
        }
        free(ppcVar5);
      }
      ppsVar1 = local_50;
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_40);
    if (iVar2 == 0) {
      psVar4 = (shape_t *)realloc(*local_50,0);
      *ppsVar1 = psVar4;
    }
    ppcVar5 = local_58;
    if (local_58 == (char **)0x0) {
      return iVar2;
    }
    if (fields_number != 0) {
      uVar7 = 0;
      do {
        free(ppcVar5[uVar7]);
        uVar7 = uVar7 + 1;
      } while (fields_number != uVar7);
    }
  }
  free(ppcVar5);
  return iVar2;
}

Assistant:

int read_all_shapes(FILE *fp, shape_t **records) {
    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }

    if (lines_count < 1) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return (lines_count < 0) ? -1 : 0;
    }

    *records = malloc(lines_count * sizeof(**records));
    if (*records == NULL) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return -1;
    }

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            read_shape(&(*records)[i], field_count, (const char **)field_names, (const char **)record_values);
            // free_cstr_arr(record_values, field_count);
            record_count++;
        }
        free_cstr_arr(record_values, field_count);
    }

    if (record_count == 0)
        *records = realloc(*records, record_count * sizeof(**records));

    free_cstr_arr(field_names, field_count);
    return record_count;
}